

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismModel::_build_k4_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,bool pattern)

{
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint a;
  uint a_00;
  uint a_01;
  value_type nv;
  value_type cn1;
  value_type common_neighbours;
  value_type cn2;
  SVOBitset local_250;
  SVOBitset local_1c8;
  SVOBitset local_140;
  SVOBitset local_b8;
  
  for (a_01 = 0; a_01 != size; a_01 = a_01 + 1) {
    SVOBitset::SVOBitset
              (&local_250,
               (graph_rows->
               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
               )._M_impl.super__Vector_impl_data._M_start + this->max_graphs * a_01);
    a_00 = 0;
    while( true ) {
      if (a_00 == a_01) break;
      bVar2 = SVOBitset::test(&local_250,a_00);
      if (bVar2) {
        SVOBitset::SVOBitset
                  (&local_140,
                   (graph_rows->
                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                   )._M_impl.super__Vector_impl_data._M_start + this->max_graphs * a_00);
        SVOBitset::operator&=(&local_140,&local_250);
        SVOBitset::reset(&local_140,a_01);
        SVOBitset::reset(&local_140,a_00);
        uVar4 = SVOBitset::count(&local_140);
        if (1 < uVar4) {
          SVOBitset::SVOBitset(&local_1c8,&local_140);
          bVar2 = false;
          while( true ) {
            uVar4 = SVOBitset::find_first(&local_1c8);
            if ((uVar4 == 0xffffffff) || (bVar2)) break;
            SVOBitset::reset(&local_1c8,uVar4);
            SVOBitset::SVOBitset(&local_b8,&local_140);
            while( true ) {
              a = SVOBitset::find_first(&local_b8);
              if ((a == 0xffffffff) || (bVar2)) break;
              SVOBitset::reset(&local_b8,a);
              if ((((a_00 != a) && (a_00 != uVar4)) && (a_01 != uVar4)) && (a_01 != a)) {
                bVar3 = SVOBitset::test((graph_rows->
                                        super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                        )._M_impl.super__Vector_impl_data._M_start +
                                        this->max_graphs * uVar4,a);
                if (bVar3) {
                  SVOBitset::set((graph_rows->
                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                 )._M_impl.super__Vector_impl_data._M_start +
                                 (this->max_graphs * a_01 + *idx),a_00);
                  SVOBitset::set((graph_rows->
                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                                 )._M_impl.super__Vector_impl_data._M_start +
                                 (this->max_graphs * a_00 + *idx),a_01);
                  bVar2 = true;
                }
              }
            }
            SVOBitset::~SVOBitset(&local_b8);
          }
          SVOBitset::~SVOBitset(&local_1c8);
        }
        SVOBitset::~SVOBitset(&local_140);
      }
      a_00 = a_00 + 1;
    }
    SVOBitset::~SVOBitset(&local_250);
  }
  if (pattern) {
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"k4",(allocator<char> *)&local_140);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(_Var1._M_head_impl)->supplemental_graph_names,(value_type *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
  }
  *idx = *idx + 1;
  return;
}

Assistant:

auto HomomorphismModel::_build_k4_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx, bool pattern) -> void
{
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        for (unsigned w = 0; w < v; ++w) {
            if (nv.test(w)) {
                // are there two common neighbours with an edge between them?
                auto common_neighbours = graph_rows[w * max_graphs + 0];
                common_neighbours &= nv;
                common_neighbours.reset(v);
                common_neighbours.reset(w);
                auto count = common_neighbours.count();
                if (count >= 2) {
                    bool done = false;
                    auto cn1 = common_neighbours;
                    for (auto x = cn1.find_first(); x != decltype(cn1)::npos && ! done; x = cn1.find_first()) {
                        cn1.reset(x);
                        auto cn2 = common_neighbours;
                        for (auto y = cn2.find_first(); y != decltype(cn2)::npos && ! done; y = cn2.find_first()) {
                            cn2.reset(y);
                            if (v != w && v != x && v != y && w != x && w != y && graph_rows[x * max_graphs + 0].test(y)) {
                                graph_rows[v * max_graphs + idx].set(w);
                                graph_rows[w * max_graphs + idx].set(v);
                                done = true;
                            }
                        }
                    }
                }
            }
        }
    }

    if (pattern)
        _imp->supplemental_graph_names.push_back("k4");
    ++idx;
}